

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O3

void __thiscall
fmt::v9::dynamic_format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>::
emplace_arg<char>(dynamic_format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>
                  *this,char *arg)

{
  pointer *ppbVar1;
  iterator __position;
  basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> arg_1;
  anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
  local_28;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined8 uStack_10;
  
  local_18 = 8;
  local_28.long_long_value = (longlong)(byte)*arg;
  __position._M_current =
       (this->data_).
       super__Vector_base<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>,_std::allocator<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->data_).
      super__Vector_base<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>,_std::allocator<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>,std::allocator<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>>>
    ::
    _M_realloc_insert<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>>
              ((vector<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>,std::allocator<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>>>
                *)this,__position,
               (basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)
               &local_28.string);
  }
  else {
    *(ulong *)&(__position._M_current)->type_ = CONCAT44(uStack_14,8);
    *(undefined8 *)&(__position._M_current)->field_0x18 = uStack_10;
    *(undefined8 *)&((__position._M_current)->value_).field_0 = local_28.long_long_value;
    ((__position._M_current)->value_).field_0.string.size = local_28.string.size;
    ppbVar1 = &(this->data_).
               super__Vector_base<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>,_std::allocator<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppbVar1 = *ppbVar1 + 1;
  }
  return;
}

Assistant:

void emplace_arg(const T& arg) {
    data_.emplace_back(detail::make_arg<Context>(arg));
  }